

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O0

double gamma(double param_1)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  double dVar4;
  longdouble in_stack_00000008;
  longdouble xminin;
  longdouble xinf;
  longdouble xden;
  longdouble xbig;
  longdouble value;
  longdouble sum;
  longdouble sqrtpi;
  longdouble z;
  longdouble ysq;
  longdouble y1;
  longdouble y;
  longdouble xnum;
  longdouble res;
  longdouble q [8];
  bool parity;
  longdouble p [8];
  int n;
  int i;
  longdouble half;
  longdouble fact;
  longdouble precision;
  longdouble c [7];
  longdouble local_218;
  int local_d0;
  int local_cc;
  
  lVar2 = _DAT_02043f90;
  lVar1 = _DAT_02043f70;
  dVar4 = -7.806410675221932e+263;
  local_d0 = 0;
  local_218 = in_stack_00000008;
  if (in_stack_00000008 <= (longdouble)0) {
    local_218 = -in_stack_00000008;
    if ((local_218 - (longdouble)(int)ROUND(local_218) == (longdouble)0) &&
       (!NAN(local_218 - (longdouble)(int)ROUND(local_218)) && !NAN((longdouble)0))) {
      return -7.806410675221932e+263;
    }
    dVar4 = (double)sinl();
    local_218 = (longdouble)1 + local_218;
  }
  lVar3 = local_218;
  if (lVar1 <= local_218) {
    if ((longdouble)12.0 <= local_218) {
      if (local_218 <= lVar2) {
        for (local_cc = 0; local_cc < 6; local_cc = local_cc + 1) {
        }
        dVar4 = std::log(dVar4);
        dVar4 = std::exp(dVar4);
      }
    }
    else {
      if ((longdouble)1 <= local_218) {
        local_d0 = (int)ROUND(local_218) + -1;
        local_218 = local_218 - (longdouble)local_d0;
      }
      else {
        local_218 = (longdouble)1 + local_218;
      }
      for (local_cc = 0; local_cc < 8; local_cc = local_cc + 1) {
      }
      if ((local_218 <= lVar3) && (local_218 < lVar3)) {
        for (local_cc = 1; local_cc <= local_d0; local_cc = local_cc + 1) {
        }
      }
    }
  }
  return dVar4;
}

Assistant:

long double gamma(long double x) {
	//  Coefficients for minimax approximation over (see reference).
	long double c[7] = { -1.910444077728E-03L, 8.4171387781295E-04L, -5.952379913043012E-04L,
		7.93650793500350248E-04L, -2.777777777777681622553E-03L, 8.333333333333333331554247E-02L,
		5.7083835261E-03L };
	long double precision = 2.22E-16L;
	long double fact, half = 0.5L;
	int i, n;
	long double p[8] = { -1.71618513886549492533811E+00L, 2.47656508055759199108314E+01L, 
		-3.79804256470945635097577E+02L, 6.29331155312818442661052E+02L, 8.66966202790413211295064E+02L, 
		-3.14512729688483675254357E+04L, -3.61444134186911729807069E+04L, 6.64561438202405440627855E+04L };
	bool parity;
	long double q[8] = { -3.08402300119738975254353E+01L, 3.15350626979604161529144E+02L, 
		-1.01515636749021914166146E+03L, -3.10777167157231109440444E+03L, 2.25381184209801510330112E+04L, 
		4.75584627752788110767815E+03L, -1.34659959864969306392456E+05L, -1.15132259675553483497211E+05L };
	long double res, xnum, y, y1, ysq, z;
	long double sqrtpi = 0.9189385332046727417803297L;
	long double sum, value, xbig = 171.624L;
	long double xden, xinf = 1.79E+308L;
	long double xminin = 2.23E-308L;

	parity = false;
	fact = 1.0L;
	n = 0;
	y = x;

	// When the argument is negative
	if(y <= 0.0) {
		y = - x;
		y1 = (long double)((int)(y));   // take the integer part
		res = y - y1;
		if(res != 0.0) {
			if( y1 != (long double)(((int)(y1*half))*2.0L)) {
				parity = true;
			}
			fact = - M_PI/sinl(M_PI*res);
			y = y + 1.0L;
		}
		else {
			res = xinf;
			value = res;
			return value;
		}
	}

	// When the argument is positive but lower than precision
	if(y < precision) {
		if(xminin <= y) res = 1.0L/y;
		else {
			res = xinf;
			value = res;
			return value;
		}
	}
	// When the argument is positive but lower than 12.0L
	else if(y < 12.0L) {
		y1 = y;
		if(y < 1.0L) {
			z = y;
			y = y + 1.0L;
		}
		else {      // note the value is not higher than 12.0L 
			n = (int)(y) - 1;
			y = y - (long double)(n);
			z = y - 1.0L;
		}
		xnum = 0.0;
		xden = 1.0L;
		for(i=0;i<8;i++) {
			xnum = (xnum + p[i])*z;
			xden = xden*z + q[i];
		}
		res = xnum/xden + 1.0L;
		if(y1 < y) {
			res = res/y1;
		}
		else if(y < y1) {
			for(i=1;i<=n;i++) {
				res = res*y;
				y = y + 1.0L;
			}
		}
	}
	// When the argument is higher than 12.0L
	else {
		if(y <= xbig) {
			ysq = y * y;
			sum = c[6];
			for(i=0;i<6;i++) {
				sum = sum / ysq + c[i];
			}
			sum = sum / y - y + sqrtpi;
			sum = sum + (y-half)*log(y);
			res = exp(sum);
		}
		else {
			res = xinf;
			value = res;
			return value;
		}
	}
	// Adjusting
	if(parity) res = - res;
	if(fact != 1.0L) res = fact/res;

	return res;
}